

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

bool Assimp::Ogre::OgreBinarySerializer::ImportSkeleton(IOSystem *pIOHandler,MeshXml *mesh)

{
  ulong uVar1;
  element_type *peVar2;
  Skeleton *this;
  undefined1 local_68 [8];
  OgreBinarySerializer serializer;
  Skeleton *skeleton;
  undefined1 local_30 [8];
  MemoryStreamReaderPtr reader;
  MeshXml *mesh_local;
  IOSystem *pIOHandler_local;
  
  if ((mesh == (MeshXml *)0x0) ||
     (reader.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh,
     uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) != 0)) {
    pIOHandler_local._7_1_ = false;
  }
  else {
    OpenReader((OgreBinarySerializer *)local_30,pIOHandler,
               (string *)
               reader.
               super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    peVar2 = std::__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>
                         *)local_30);
    pIOHandler_local._7_1_ = peVar2 != (element_type *)0x0;
    if (pIOHandler_local._7_1_) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      peVar2 = std::__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>::
               get((__shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2> *)
                   local_30);
      OgreBinarySerializer((OgreBinarySerializer *)local_68,peVar2,AM_Skeleton);
      ReadSkeleton((OgreBinarySerializer *)local_68,this);
      reader.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)this;
    }
    std::shared_ptr<Assimp::StreamReader<false,_false>_>::~shared_ptr
              ((shared_ptr<Assimp::StreamReader<false,_false>_> *)local_30);
  }
  return pIOHandler_local._7_1_;
}

Assistant:

bool OgreBinarySerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, MeshXml *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    MemoryStreamReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreBinarySerializer serializer(reader.get(), OgreBinarySerializer::AM_Skeleton);
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}